

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O2

SubpassMetaStorage *
Fossilize::StateRecorder::Impl::analyze_subpass_meta_storage<VkRenderPassCreateInfo2>
          (SubpassMetaStorage *__return_storage_ptr__,VkRenderPassCreateInfo2 *info)

{
  uint uVar1;
  VkAttachmentReference2 **ppVVar2;
  byte bVar3;
  ulong uVar4;
  SubpassMetaStorage *pSVar5;
  bool bVar6;
  
  (__return_storage_ptr__->fallback).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->fallback).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __return_storage_ptr__->embedded = 0;
  __return_storage_ptr__->subpass_count = 0;
  (__return_storage_ptr__->fallback).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  uVar1 = info->subpassCount;
  __return_storage_ptr__->subpass_count = uVar1;
  if (0x10 < uVar1) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
              (&__return_storage_ptr__->fallback,(ulong)(uVar1 - 1 >> 4));
  }
  ppVVar2 = &info->pSubpasses->pDepthStencilAttachment;
  bVar3 = 0;
  for (uVar4 = 0; uVar4 < info->subpassCount; uVar4 = uVar4 + 1) {
    if (*ppVVar2 == (VkAttachmentReference2 *)0x0) {
      bVar6 = false;
    }
    else {
      bVar6 = (*ppVVar2)->attachment != 0xffffffff;
    }
    pSVar5 = (SubpassMetaStorage *)
             ((ulong)((int)uVar4 - 0x10U >> 2 & 0xfffffffc) +
             (long)(__return_storage_ptr__->fallback).
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start);
    if (uVar4 < 0x10) {
      pSVar5 = __return_storage_ptr__;
    }
    if (*(uint32_t *)(ppVVar2 + -3) != 0) {
      pSVar5->embedded = pSVar5->embedded | 1 << (bVar3 & 0x1e);
    }
    if (bVar6) {
      pSVar5->embedded = pSVar5->embedded | 2 << (bVar3 & 0x1e);
    }
    bVar3 = bVar3 + 2;
    ppVVar2 = ppVVar2 + 0xb;
  }
  return __return_storage_ptr__;
}

Assistant:

StateRecorder::Impl::SubpassMetaStorage StateRecorder::Impl::analyze_subpass_meta_storage(const CreateInfo &info)
{
	SubpassMetaStorage storage = {};

	storage.subpass_count = info.subpassCount;
	if (info.subpassCount > 16)
		storage.fallback.resize(((info.subpassCount - 16) + 15) / 16);

	for (uint32_t i = 0; i < info.subpassCount; i++)
	{
		bool uses_color = info.pSubpasses[i].colorAttachmentCount > 0;
		bool uses_depth_stencil =
				info.pSubpasses[i].pDepthStencilAttachment != nullptr &&
				info.pSubpasses[i].pDepthStencilAttachment->attachment != VK_ATTACHMENT_UNUSED;

		uint32_t &mask = i < 16 ? storage.embedded : storage.fallback[(i - 16) / 16];
		if (uses_color)
			mask |= 1u << (2 * (i & 15) + 0);
		if (uses_depth_stencil)
			mask |= 1u << (2 * (i & 15) + 1);
	}

	return storage;
}